

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CandidateVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature
          (CandidateVector *__return_storage_ptr__,Feature feature)

{
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_00;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_01;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_02;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_03;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_04;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_05;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_06;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_07;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_08;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_09;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_10;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate> init_11;
  Candidate local_188 [2];
  iterator local_180;
  undefined8 local_178;
  Candidate local_16c;
  iterator local_168;
  undefined8 local_160;
  Candidate local_154;
  iterator local_150;
  undefined8 local_148;
  Candidate local_140 [4];
  iterator local_130;
  undefined8 local_128;
  Candidate local_11c [3];
  iterator local_110;
  undefined8 local_108;
  Candidate local_100 [4];
  iterator local_f0;
  undefined8 local_e8;
  Candidate local_e0 [2];
  iterator local_d8;
  undefined8 local_d0;
  Candidate local_c4 [3];
  iterator local_b8;
  undefined8 local_b0;
  Candidate local_a8 [2];
  iterator local_a0;
  undefined8 local_98;
  Candidate local_90 [2];
  iterator local_88;
  undefined8 local_80;
  Candidate local_74 [3];
  iterator local_68;
  undefined8 local_60;
  Candidate local_58 [4];
  iterator local_48;
  undefined8 local_40;
  Candidate local_34 [3];
  iterator local_28;
  undefined8 local_20;
  Feature local_14;
  CandidateVector *pCStack_10;
  Feature feature_local;
  
  local_14 = feature;
  pCStack_10 = __return_storage_ptr__;
  switch(feature) {
  case SubgroupMask:
    local_34[0] = KHR_shader_subgroup_ballot;
    local_34[1] = 5;
    local_34[2] = 7;
    local_28 = local_34;
    local_20 = 3;
    init_11._M_len = 3;
    init_11._M_array = local_28;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_11);
    break;
  case SubgroupSize:
    local_58[0] = KHR_shader_subgroup_basic;
    local_58[1] = 5;
    local_58[2] = 9;
    local_58[3] = 7;
    local_48 = local_58;
    local_40 = 4;
    init_10._M_len = 4;
    init_10._M_array = local_48;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_10);
    break;
  case SubgroupInvocationID:
    local_74[0] = KHR_shader_subgroup_basic;
    local_74[1] = 5;
    local_74[2] = 7;
    local_68 = local_74;
    local_60 = 3;
    init_09._M_len = 3;
    init_09._M_array = local_68;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_09);
    break;
  case SubgroupID:
    local_90[0] = KHR_shader_subgroup_basic;
    local_90[1] = 5;
    local_88 = local_90;
    local_80 = 2;
    init_08._M_len = 2;
    init_08._M_array = local_88;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_08);
    break;
  case NumSubgroups:
    local_a8[0] = KHR_shader_subgroup_basic;
    local_a8[1] = 5;
    local_a0 = local_a8;
    local_98 = 2;
    init_07._M_len = 2;
    init_07._M_array = local_a0;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_07);
    break;
  case SubgroupBroadcast_First:
    local_c4[0] = KHR_shader_subgroup_ballot;
    local_c4[1] = 6;
    local_c4[2] = 7;
    local_b8 = local_c4;
    local_b0 = 3;
    init_06._M_len = 3;
    init_06._M_array = local_b8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_06);
    break;
  case SubgroupBallotFindLSB_MSB:
    local_e0[0] = KHR_shader_subgroup_ballot;
    local_e0[1] = 5;
    local_d8 = local_e0;
    local_d0 = 2;
    init_05._M_len = 2;
    init_05._M_array = local_d8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_05);
    break;
  case SubgroupAll_Any_AllEqualBool:
    local_100[0] = KHR_shader_subgroup_vote;
    local_100[1] = 4;
    local_100[2] = 8;
    local_100[3] = 9;
    local_f0 = local_100;
    local_e8 = 4;
    init_04._M_len = 4;
    init_04._M_array = local_f0;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_04);
    break;
  case SubgroupAllEqualT:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector(__return_storage_ptr__);
    break;
  case SubgroupElect:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector(__return_storage_ptr__);
    break;
  case SubgroupBarrier:
    local_140[0] = KHR_shader_subgroup_basic;
    local_140[1] = 5;
    local_140[2] = 7;
    local_140[3] = 9;
    local_130 = local_140;
    local_128 = 4;
    init_02._M_len = 4;
    init_02._M_array = local_130;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_02);
    break;
  case SubgroupMemBarrier:
    local_154 = KHR_shader_subgroup_basic;
    local_150 = &local_154;
    local_148 = 1;
    init_01._M_len = 1;
    init_01._M_array = local_150;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_01);
    break;
  case SubgroupBallot:
    local_11c[0] = KHR_shader_subgroup_ballot;
    local_11c[1] = 5;
    local_11c[2] = 7;
    local_110 = local_11c;
    local_108 = 3;
    init_03._M_len = 3;
    init_03._M_array = local_110;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_03);
    break;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector(__return_storage_ptr__);
    break;
  case SubgroupBallotBitExtract:
    local_16c = NV_shader_thread_group;
    local_168 = &local_16c;
    local_160 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_168;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init_00);
    break;
  case SubgroupBallotBitCount:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector(__return_storage_ptr__);
    break;
  case SubgroupArithmeticIAddReduce:
  case SubgroupArithmeticIAddExclusiveScan:
  case SubgroupArithmeticIAddInclusiveScan:
  case SubgroupArithmeticFAddReduce:
  case SubgroupArithmeticFAddExclusiveScan:
  case SubgroupArithmeticFAddInclusiveScan:
  case SubgroupArithmeticIMulReduce:
  case SubgroupArithmeticIMulExclusiveScan:
  case SubgroupArithmeticIMulInclusiveScan:
  case SubgroupArithmeticFMulReduce:
  case SubgroupArithmeticFMulExclusiveScan:
  case SubgroupArithmeticFMulInclusiveScan:
    local_188[0] = KHR_shader_subgroup_arithmetic;
    local_188[1] = 6;
    local_180 = local_188;
    local_178 = 2;
    init._M_len = 2;
    init._M_array = local_180;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              (__return_storage_ptr__,init);
    break;
  default:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
    SmallVector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::CandidateVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_candidates_for_feature(Feature feature)
{
	switch (feature)
	{
	case SubgroupMask:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupSize:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, AMD_gcn_shader, ARB_shader_ballot };
	case SubgroupInvocationID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case NumSubgroups:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case SubgroupBroadcast_First:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_shuffle, ARB_shader_ballot };
	case SubgroupBallotFindLSB_MSB:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group };
	case SubgroupAll_Any_AllEqualBool:
		return { KHR_shader_subgroup_vote, NV_gpu_shader_5, ARB_shader_group_vote, AMD_gcn_shader };
	case SubgroupAllEqualT:
		return {}; // depends on other features only
	case SubgroupElect:
		return {}; // depends on other features only
	case SubgroupBallot:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupBarrier:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot, AMD_gcn_shader };
	case SubgroupMemBarrier:
		return { KHR_shader_subgroup_basic };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return {};
	case SubgroupBallotBitExtract:
		return { NV_shader_thread_group };
	case SubgroupBallotBitCount:
		return {};
	case SubgroupArithmeticIAddReduce:
	case SubgroupArithmeticIAddExclusiveScan:
	case SubgroupArithmeticIAddInclusiveScan:
	case SubgroupArithmeticFAddReduce:
	case SubgroupArithmeticFAddExclusiveScan:
	case SubgroupArithmeticFAddInclusiveScan:
	case SubgroupArithmeticIMulReduce:
	case SubgroupArithmeticIMulExclusiveScan:
	case SubgroupArithmeticIMulInclusiveScan:
	case SubgroupArithmeticFMulReduce:
	case SubgroupArithmeticFMulExclusiveScan:
	case SubgroupArithmeticFMulInclusiveScan:
		return { KHR_shader_subgroup_arithmetic, NV_shader_thread_shuffle };
	default:
		return {};
	}
}